

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateWindowParentAndRootLinks
               (ImGuiWindow *window,ImGuiWindowFlags flags,ImGuiWindow *parent_window)

{
  ImGuiWindow *parent_window_local;
  ImGuiWindowFlags flags_local;
  ImGuiWindow *window_local;
  
  window->ParentWindow = parent_window;
  window->RootWindowForNav = window;
  window->RootWindowForTitleBarHighlight = window;
  window->RootWindow = window;
  if (((parent_window != (ImGuiWindow *)0x0) && ((flags & 0x1000000U) != 0)) &&
     ((flags & 0x2000000U) == 0)) {
    window->RootWindow = parent_window->RootWindow;
  }
  if (((parent_window != (ImGuiWindow *)0x0) && ((flags & 0x8000000U) == 0)) &&
     ((flags & 0x5000000U) != 0)) {
    window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
  }
  while ((window->RootWindowForNav->Flags & 0x800000U) != 0) {
    window->RootWindowForNav = window->RootWindowForNav->ParentWindow;
  }
  return;
}

Assistant:

void ImGui::UpdateWindowParentAndRootLinks(ImGuiWindow* window, ImGuiWindowFlags flags, ImGuiWindow* parent_window)
{
    window->ParentWindow = parent_window;
    window->RootWindow = window->RootWindowForTitleBarHighlight = window->RootWindowForNav = window;
    if (parent_window && (flags & ImGuiWindowFlags_ChildWindow) && !(flags & ImGuiWindowFlags_Tooltip))
        window->RootWindow = parent_window->RootWindow;
    if (parent_window && !(flags & ImGuiWindowFlags_Modal) && (flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_Popup)))
        window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
    while (window->RootWindowForNav->Flags & ImGuiWindowFlags_NavFlattened)
        window->RootWindowForNav = window->RootWindowForNav->ParentWindow;
}